

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio-logger.cpp
# Opt level: O2

bool __thiscall AudioLogger::isValidBufferSize(AudioLogger *this,float bufferSize_s)

{
  if (bufferSize_s <= 0.0) {
    fprintf(_stderr,"error : invalid bufferSize_s = %g\n",(double)bufferSize_s);
  }
  else {
    if (bufferSize_s <= 5.0) {
      return true;
    }
    fprintf(_stderr,"error : invalid record size requested - %g s. max allowed is %g s\n",
            (double)bufferSize_s,0x4014000000000000);
  }
  return false;
}

Assistant:

bool AudioLogger::isValidBufferSize(float bufferSize_s) const {
    if (bufferSize_s <= 0) {
        fprintf(stderr, "error : invalid bufferSize_s = %g\n", bufferSize_s);
        return false;
    }

    if (bufferSize_s > kMaxBufferSize_s) {
        fprintf(stderr, "error : invalid record size requested - %g s. max allowed is %g s\n", bufferSize_s, kMaxBufferSize_s);
        return false;
    }

    return true;
}